

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

int unpack_init(WavpackContext *wpc)

{
  long lVar1;
  long lVar2;
  int iVar3;
  WavpackContext *wpc_00;
  long in_RDI;
  long in_FS_OFFSET;
  WavpackStream *wps;
  WavpackMetadata wpmd;
  WavpackMetadata *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_24;
  char local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wpc_00 = (WavpackContext *)(in_RDI + 0x20);
  if ((*(int *)(in_RDI + 0x34) != 0) && (*(int *)(in_RDI + 0x30) != -1)) {
    *(undefined4 *)(in_RDI + 0xcc) = *(undefined4 *)(in_RDI + 0x30);
  }
  *(undefined4 *)(in_RDI + 200) = 0;
  *(undefined4 *)(in_RDI + 0xd0) = 0xffffffff;
  memset((void *)(in_RDI + 0x40),0,0x38);
  memset(&(wpc_00->stream).w.c[1].slow_level,0,0x480);
  memset(&(wpc_00->stream).wvbits.wrap,0,0x4c);
  do {
    iVar3 = read_metadata_buff((WavpackContext *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
    if (iVar3 == 0) break;
    iVar3 = process_metadata(wpc_00,(WavpackMetadata *)
                                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar3 == 0) {
      strcpy((char *)(in_RDI + 0x960),"invalid metadata!");
      local_24 = 0;
      goto LAB_0021d9e2;
    }
  } while (local_10 != '\n');
  if (((wpc_00->config).sample_rate == 0) ||
     (lVar2._0_4_ = (wpc_00->stream).wphdr.block_index,
     lVar2._4_4_ = (wpc_00->stream).wphdr.block_samples, lVar2 != 0)) {
    if ((wpc_00->config).sample_rate != 0) {
      if ((((wpc_00->config).channel_mask & 0x100) != 0) &&
         ((char)(wpc_00->stream).w.c[1].median[1] != '\0')) {
        *(undefined4 *)(in_RDI + 0x9d0) = 1;
      }
      if ((((wpc_00->config).channel_mask & 0x80) != 0) &&
         (((wpc_00->stream).w.c[1].median[2] & 0x2e) != 0)) {
        *(undefined4 *)(in_RDI + 0x9d0) = 1;
      }
    }
    local_24 = 1;
  }
  else {
    strcpy((char *)(in_RDI + 0x960),"invalid WavPack file!");
    local_24 = 0;
  }
LAB_0021d9e2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

int unpack_init (WavpackContext *wpc)
{
    WavpackStream *wps = &wpc->stream;
    WavpackMetadata wpmd;

    if (wps->wphdr.block_samples && wps->wphdr.block_index != (uint32_t) -1)
        wps->sample_index = wps->wphdr.block_index;

    wps->mute_error = FALSE;
    wps->crc = 0xffffffff;
    CLEAR (wps->wvbits);
    CLEAR (wps->decorr_passes);
    CLEAR (wps->w);

    while (read_metadata_buff (wpc, &wpmd)) {
        if (!process_metadata (wpc, &wpmd)) {
            strcpy (wpc->error_message, "invalid metadata!");
            return FALSE;
        }

        if (wpmd.id == ID_WV_BITSTREAM)
            break;
    }

    if (wps->wphdr.block_samples && !bs_is_open (&wps->wvbits)) {
        strcpy (wpc->error_message, "invalid WavPack file!");
        return FALSE;
    }

    if (wps->wphdr.block_samples) {
        if ((wps->wphdr.flags & INT32_DATA) && wps->int32_sent_bits)
            wpc->lossy_blocks = TRUE;

        if ((wps->wphdr.flags & FLOAT_DATA) &&
            wps->float_flags & (FLOAT_EXCEPTIONS | FLOAT_ZEROS_SENT | FLOAT_SHIFT_SENT | FLOAT_SHIFT_SAME))
                wpc->lossy_blocks = TRUE;
    }

    return TRUE;
}